

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder capnp::_::WireHelpers::getWritableDataPointer
                  (WirePointer *ref,word *refTarget,SegmentBuilder *segment,
                  CapTableBuilder *capTable,void *defaultValue,BlobSize defaultSize)

{
  ArrayPtr<unsigned_char> AVar1;
  undefined8 value;
  bool bVar2;
  ElementCountN<29> i;
  uint uVar3;
  uchar *to;
  Fault local_e0;
  Fault f_1;
  undefined1 local_d0 [8];
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> _kjCondition_1;
  Fault local_a0;
  Fault f;
  Kind local_90;
  DebugExpression<capnp::_::WirePointer::Kind> local_8c;
  undefined1 local_88 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  word *ptr;
  WirePointer *local_58;
  uchar *local_50;
  BlobSize local_44;
  byte *pbStack_40;
  BlobSize defaultSize_local;
  void *defaultValue_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  word *refTarget_local;
  WirePointer *ref_local;
  Builder builder;
  
  local_44 = defaultSize;
  pbStack_40 = (byte *)defaultValue;
  defaultValue_local = capTable;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)refTarget;
  refTarget_local = (word *)ref;
  bVar2 = WirePointer::isNull(ref);
  if (!bVar2) {
    _kjCondition._24_8_ =
         followFars((WirePointer **)&refTarget_local,(word *)segment_local,
                    (SegmentBuilder **)&capTable_local);
    local_90 = WirePointer::kind((WirePointer *)refTarget_local);
    local_8c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_88
               ,&local_8c,(Kind *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
    if (bVar2) {
      f_1.exception._6_1_ =
           WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      f_1.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (ElementSize *)((long)&f_1.exception + 6));
      f_1.exception._5_1_ = 2;
      kj::_::DebugExpression<capnp::ElementSize>::operator==
                ((DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                 (DebugExpression<capnp::ElementSize> *)((long)&f_1.exception + 7),
                 (ElementSize *)((long)&f_1.exception + 5));
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
      value = _kjCondition._24_8_;
      if (bVar2) {
        i = WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
        uVar3 = unbound<unsigned_int>(i);
        Data::Builder::Builder((Builder *)&ref_local,(byte *)value,(ulong)uVar3);
        goto LAB_0029009a;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                (&local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6de,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                 "_kjCondition,\"Schema mismatch: Called getData{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                 ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d0,
                 (char (*) [94])
                 "Schema mismatch: Called getData{Field,Element}() but existing list pointer is not byte-sized."
                );
      kj::_::Debug::Fault::~Fault(&local_e0);
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6d9,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getData{Field,Element}() but existing pointer is not a list.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  local_88,
                 (char (*) [85])
                 "Schema mismatch: Called getData{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&local_a0);
    }
  }
  if (local_44 == 0) {
    Data::Builder::Builder((Builder *)&ref_local,(void *)0x0);
  }
  else {
    initDataPointer((SegmentAnd<capnp::Data::Builder> *)&ptr,(WirePointer *)refTarget_local,
                    (SegmentBuilder *)capTable_local,(CapTableBuilder *)defaultValue_local,local_44,
                    (BuilderArena *)0x0);
    ref_local = local_58;
    builder.super_ArrayPtr<unsigned_char>.ptr = local_50;
    to = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&ref_local);
    copyMemory(to,pbStack_40,local_44);
  }
LAB_0029009a:
  AVar1.size_ = (size_t)builder.super_ArrayPtr<unsigned_char>.ptr;
  AVar1.ptr = (uchar *)ref_local;
  return (Builder)AVar1;
}

Assistant:

static KJ_ALWAYS_INLINE(Data::Builder getWritableDataPointer(
      WirePointer* ref, word* refTarget, SegmentBuilder* segment, CapTableBuilder* capTable,
      const void* defaultValue, BlobSize defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultSize == ZERO * BYTES) {
        return nullptr;
      } else {
        Data::Builder builder = initDataPointer(ref, segment, capTable, defaultSize).value;
        copyMemory(builder.begin(), reinterpret_cast<const byte*>(defaultValue), defaultSize);
        return builder;
      }
    } else {
      word* ptr = followFars(ref, refTarget, segment);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
          "Schema mismatch: Called getData{Field,Element}() but existing pointer is not a list.") {
        goto useDefault;
      }
      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
          "Schema mismatch: Called getData{Field,Element}() but existing list pointer is not "
          "byte-sized.") {
        goto useDefault;
      }

      return Data::Builder(reinterpret_cast<byte*>(ptr),
          unbound(ref->listRef.elementCount() / ELEMENTS));
    }
  }